

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

bool __thiscall QRasterPaintEngine::begin(QRasterPaintEngine *this,QPaintDevice *device)

{
  undefined1 *puVar1;
  int iVar2;
  QPaintEnginePrivate *pQVar3;
  QPaintEngineState *pQVar4;
  QPaintEnginePrivate *pQVar5;
  qreal qVar6;
  EVP_PKEY_CTX *ctx;
  int iVar7;
  int iVar8;
  int iVar9;
  QPlatformPixmap *pQVar10;
  undefined4 extraout_var;
  long lVar11;
  QTransform *pQVar12;
  qreal *pqVar13;
  QPaintEngineState *pQVar14;
  long in_FS_OFFSET;
  byte bVar15;
  qreal scale;
  _Head_base<0UL,_QBrushData_*,_false> local_38;
  long local_30;
  
  bVar15 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  iVar9 = (*device->_vptr_QPaintDevice[2])(device);
  if (iVar9 == 2) {
    pQVar10 = QPixmap::handle((QPixmap *)device);
    if ((pQVar10->id & 0xfffffffdU) == 0) {
      iVar9 = (*pQVar10->_vptr_QPlatformPixmap[0x16])(pQVar10);
      device = (QPaintDevice *)CONCAT44(extraout_var,iVar9);
      pQVar3[3].systemTransform.m_matrix[0][0] = (qreal)device;
    }
    else {
      device = (QPaintDevice *)pQVar3[3].systemTransform.m_matrix[0][0];
    }
  }
  else {
    pQVar3[3].systemTransform.m_matrix[0][0] = (qreal)device;
  }
  pQVar3->pdev = device;
  (*pQVar3->_vptr_QPaintEnginePrivate[2])(pQVar3);
  pQVar4 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  pQVar5 = (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar14 = pQVar4 + -2;
  if (pQVar4 == (QPaintEngineState *)0x0) {
    pQVar14 = (QPaintEngineState *)0x0;
  }
  if (((ulong)pQVar5[10].baseSystemClip.d & 0x200000000) != 0) {
    qVar6 = pQVar5[3].systemTransform.m_matrix[0][1];
    pQVar12 = (QTransform *)(pQVar14 + 0x36);
    pqVar13 = (qreal *)((long)qVar6 + 0xf8);
    for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
      *pqVar13 = pQVar12->m_matrix[0][0];
      pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar15 * -2 + 1) * 8);
      pqVar13 = pqVar13 + (ulong)bVar15 * -2 + 1;
    }
    *(short *)((long)qVar6 + 0x140) =
         (short)pQVar14[0x48].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                super_QFlagsStorage<QPaintEngine::DirtyFlag>.i;
    local_38._M_head_impl = (QBrushData *)0xffffffffffffffff;
    qt_scaleForTransform((QTransform *)(pQVar14 + 0x36),(qreal *)&local_38);
    *(ulong *)((long)qVar6 + 0x148) =
         -(ulong)((double)local_38._M_head_impl == 0.0) & 0x3fd0000000000000 |
         ~-(ulong)((double)local_38._M_head_impl == 0.0) &
         (ulong)(0.25 / (double)local_38._M_head_impl);
  }
  QOutlineMapper::setClipRect
            ((QOutlineMapper *)pQVar3[3].systemTransform.m_matrix[0][1],
             *(QRect *)(pQVar3[3].systemTransform.m_matrix + 1));
  QRasterizer::setClipRect
            ((QRasterizer *)pQVar3[10].systemClip.d,
             (QRect *)(pQVar3[3].systemTransform.m_matrix + 1));
  QSpanData::init((QSpanData *)(pQVar14 + 0x72),
                  (EVP_PKEY_CTX *)pQVar3[3].systemTransform.m_matrix[0][2]);
  QPen::brush((QPen *)&local_38);
  QSpanData::setup((QSpanData *)(pQVar14 + 0x72),(QBrush *)&local_38,
                   pQVar14[0xfe].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   pQVar14[0x6d].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   (bool)(*(byte *)((long)&pQVar14[0x105].dirtyFlags.
                                           super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                                           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i + 1) & 1))
  ;
  QBrush::~QBrush((QBrush *)&local_38);
  *(qreal **)(pQVar14 + 0xb4) = pQVar3[3].systemTransform.m_matrix[2] + 1;
  iVar9 = *(int *)(pQVar3[3].systemTransform.m_matrix[1] + 1);
  iVar2 = *(int *)((long)pQVar3[3].systemTransform.m_matrix[1] + 0xc);
  qVar6 = pQVar3[3].systemTransform.m_matrix[1][0];
  iVar7 = SUB84(qVar6,0);
  iVar8 = (int)((ulong)qVar6 >> 0x20);
  ctx = (EVP_PKEY_CTX *)pQVar3[3].systemTransform.m_matrix[0][2];
  *(double *)&pQVar3[3].field_0x98 = (double)iVar7;
  pQVar3[4]._vptr_QPaintEnginePrivate = (_func_int **)(double)iVar8;
  pQVar3[4].pdev = (QPaintDevice *)(double)(((long)iVar9 - (long)iVar7) + 1);
  pQVar3[4].q_ptr = (QPaintEngine *)(double)(((long)iVar2 - (long)iVar8) + 1);
  QSpanData::init((QSpanData *)(pQVar14 + 0xba),ctx);
  QSpanData::setup((QSpanData *)(pQVar14 + 0xba),(QBrush *)(pQVar14 + 0x12),
                   pQVar14[0xfe].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   pQVar14[0x6d].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   (bool)(*(byte *)((long)&pQVar14[0x105].dirtyFlags.
                                           super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                                           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i + 1) & 1))
  ;
  *(undefined4 *)((long)pQVar3[3].systemTransform.m_matrix[0][2] + 0xc) = 0;
  pQVar14 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  (pQVar14->dirtyFlags).super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
  super_QFlagsStorage<QPaintEngine::DirtyFlag>.i =
       (pQVar14->dirtyFlags).super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
       super_QFlagsStorage<QPaintEngine::DirtyFlag>.i | 4;
  *(uint *)&pQVar3[10].pdev = 2 - (*(byte *)((long)&pQVar3[10].baseSystemClip.d + 4) & 1);
  puVar1 = &(this->super_QPaintEngineEx).super_QPaintEngine.field_0x14;
  *puVar1 = *puVar1 | 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QRasterPaintEngine::begin(QPaintDevice *device)
{
    Q_D(QRasterPaintEngine);

    if (device->devType() == QInternal::Pixmap) {
        QPixmap *pixmap = static_cast<QPixmap *>(device);
        QPlatformPixmap *pd = pixmap->handle();
        if (pd->classId() == QPlatformPixmap::RasterClass || pd->classId() == QPlatformPixmap::BlitterClass)
            d->device = pd->buffer();
    } else {
        d->device = device;
    }

    // Make sure QPaintEngine::paintDevice() returns the proper device.
    d->pdev = d->device;

    Q_ASSERT(d->device->devType() == QInternal::Image
             || d->device->devType() == QInternal::CustomRaster);

    d->systemStateChanged();

    QRasterPaintEngineState *s = state();
    ensureOutlineMapper();
    d->outlineMapper->setClipRect(d->deviceRect);
    d->rasterizer->setClipRect(d->deviceRect);

    s->penData.init(d->rasterBuffer.data(), this);
    s->penData.setup(s->pen.brush(), s->intOpacity, s->composition_mode, s->flags.cosmetic_brush);
    s->stroker = &d->basicStroker;
    d->basicStroker.setClipRect(d->deviceRect);

    s->brushData.init(d->rasterBuffer.data(), this);
    s->brushData.setup(s->brush, s->intOpacity, s->composition_mode, s->flags.cosmetic_brush);

    d->rasterBuffer->compositionMode = QPainter::CompositionMode_SourceOver;

    setDirty(DirtyBrushOrigin);

#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::begin(" << (void *) device
             << ") devType:" << device->devType()
             << "devRect:" << d->deviceRect;
    if (d->baseClip) {
        dumpClip(d->rasterBuffer->width(), d->rasterBuffer->height(), &*d->baseClip);
    }
#endif

    if (d->mono_surface)
        d->glyphCacheFormat = QFontEngine::Format_Mono;
#if defined(Q_OS_WIN)
    else if (clearTypeFontsEnabled())
#else
    else if (false)
#endif
    {
        QImage::Format format = static_cast<QImage *>(d->device)->format();
        if (format == QImage::Format_ARGB32_Premultiplied || format == QImage::Format_RGB32)
            d->glyphCacheFormat = QFontEngine::Format_A32;
        else
            d->glyphCacheFormat = QFontEngine::Format_A8;
    } else
        d->glyphCacheFormat = QFontEngine::Format_A8;

    setActive(true);
    return true;
}